

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O1

void __thiscall Param::Param(Param *this,ID *id,Type *type)

{
  Type *pTVar1;
  Field *this_00;
  string local_68;
  string local_48;
  
  Object::Object(&this->super_Object);
  this->id_ = id;
  this->type_ = type;
  (this->decl_str_)._M_dataplus._M_p = (pointer)&(this->decl_str_).field_2;
  (this->decl_str_)._M_string_length = 0;
  (this->decl_str_).field_2._M_local_buf[0] = '\0';
  if (type == (Type *)0x0) {
    pTVar1 = Type::Clone(&extern_type_int->super_Type);
    this->type_ = pTVar1;
  }
  Type::DataTypeConstRefStr_abi_cxx11_(&local_68,this->type_);
  strfmt_abi_cxx11_(&local_48,"%s %s",local_68._M_dataplus._M_p,(this->id_->name)._M_dataplus._M_p);
  std::__cxx11::string::operator=((string *)&this->decl_str_,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  this_00 = (Field *)operator_new(0xa0);
  Field::Field(this_00,PARAM_FIELD,6,this->id_,this->type_);
  (this_00->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00145368;
  this->param_field_ = this_00;
  return;
}

Assistant:

Param::Param(ID* id, Type* type) : id_(id), type_(type)
	{
	if ( ! type_ )
		type_ = extern_type_int->Clone();

	decl_str_ = strfmt("%s %s", type_->DataTypeConstRefStr().c_str(), id_->Name());

	param_field_ = new ParamField(this);
	}